

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall QDockAreaLayoutInfo::onlyHasPlaceholders(QDockAreaLayoutInfo *this)

{
  long *plVar1;
  long lVar2;
  QDockAreaLayoutItem *pQVar3;
  long lVar4;
  bool bVar5;
  
  lVar2 = (this->item_list).d.size;
  bVar5 = lVar2 == 0;
  if ((!bVar5) &&
     (pQVar3 = (this->item_list).d.ptr, pQVar3->placeHolderItem != (QPlaceHolderItem *)0x0)) {
    lVar4 = 0;
    do {
      bVar5 = lVar2 * 0x28 + -0x28 == lVar4;
      if (bVar5) {
        return bVar5;
      }
      plVar1 = (long *)((long)&pQVar3[1].placeHolderItem + lVar4);
      lVar4 = lVar4 + 0x28;
    } while (*plVar1 != 0);
  }
  return bVar5;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }